

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void pq_add(roaring_pq_t *pq,roaring_pq_element_t *t)

{
  roaring_bitmap_t *prVar1;
  roaring_pq_element_t *prVar2;
  _Bool _Var3;
  undefined7 uVar4;
  ulong uVar5;
  roaring_pq_element_t *prVar6;
  ulong uVar7;
  
  prVar6 = pq->elements;
  uVar5 = pq->size;
  pq->size = uVar5 + 1;
  prVar6[uVar5].bitmap = t->bitmap;
  _Var3 = t->is_temporary;
  uVar4 = *(undefined7 *)&t->field_0x9;
  prVar6 = prVar6 + uVar5;
  prVar6->size = t->size;
  prVar6->is_temporary = _Var3;
  *(undefined7 *)&prVar6->field_0x9 = uVar4;
  while (uVar5 != 0) {
    uVar7 = uVar5 - 1 >> 1;
    prVar6 = pq->elements;
    if (prVar6[uVar7].size <= t->size) goto LAB_0011680b;
    prVar6[uVar5].size = prVar6[uVar7].size;
    uVar4 = *(undefined7 *)&prVar6[uVar7].field_0x9;
    prVar1 = prVar6[uVar7].bitmap;
    prVar2 = prVar6 + uVar5;
    prVar2->is_temporary = prVar6[uVar7].is_temporary;
    *(undefined7 *)&prVar2->field_0x9 = uVar4;
    *(roaring_bitmap_t **)(&prVar2->is_temporary + 8) = prVar1;
    uVar5 = uVar7;
  }
  prVar6 = pq->elements;
LAB_0011680b:
  prVar6[uVar5].bitmap = t->bitmap;
  _Var3 = t->is_temporary;
  uVar4 = *(undefined7 *)&t->field_0x9;
  prVar6 = prVar6 + uVar5;
  prVar6->size = t->size;
  prVar6->is_temporary = _Var3;
  *(undefined7 *)&prVar6->field_0x9 = uVar4;
  return;
}

Assistant:

static void pq_add(roaring_pq_t *pq, roaring_pq_element_t *t) {
    uint64_t i = pq->size;
    pq->elements[pq->size++] = *t;
    while (i > 0) {
        uint64_t p = (i - 1) >> 1;
        roaring_pq_element_t ap = pq->elements[p];
        if (!compare(t, &ap)) break;
        pq->elements[i] = ap;
        i = p;
    }
    pq->elements[i] = *t;
}